

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.c
# Opt level: O0

mz_bool tdefl_output_buffer_putter(void *pBuf,int len,void *pUser)

{
  mz_uint8 *pmVar1;
  void *pvVar2;
  mz_uint8 *local_50;
  mz_uint8 *pNew_buf;
  size_t new_capacity;
  size_t new_size;
  tdefl_output_buffer *p;
  void *pUser_local;
  int len_local;
  void *pBuf_local;
  
  pmVar1 = (mz_uint8 *)(*pUser + (long)len);
  if (*(mz_uint8 **)((long)pUser + 8) < pmVar1) {
    pNew_buf = *(mz_uint8 **)((long)pUser + 8);
    if (*(int *)((long)pUser + 0x18) == 0) {
      return 0;
    }
    do {
      if ((ulong)((long)pNew_buf * 2) < 0x80) {
        local_50 = (mz_uint8 *)0x80;
      }
      else {
        local_50 = (mz_uint8 *)((long)pNew_buf << 1);
      }
      pNew_buf = local_50;
    } while (local_50 < pmVar1);
    pvVar2 = realloc(*(void **)((long)pUser + 0x10),(size_t)local_50);
    if (pvVar2 == (void *)0x0) {
      return 0;
    }
    *(void **)((long)pUser + 0x10) = pvVar2;
    *(mz_uint8 **)((long)pUser + 8) = local_50;
  }
  memcpy((void *)(*(long *)((long)pUser + 0x10) + *pUser),pBuf,(long)len);
  *(mz_uint8 **)pUser = pmVar1;
  return 1;
}

Assistant:

static mz_bool tdefl_output_buffer_putter(const void *pBuf, int len, void *pUser)
{
    tdefl_output_buffer *p = (tdefl_output_buffer *)pUser;
    size_t new_size = p->m_size + len;
    if (new_size > p->m_capacity)
    {
        size_t new_capacity = p->m_capacity;
        mz_uint8 *pNew_buf;
        if (!p->m_expandable)
            return MZ_FALSE;
        do
        {
            new_capacity = MZ_MAX(128U, new_capacity << 1U);
        } while (new_size > new_capacity);
        pNew_buf = (mz_uint8 *)MZ_REALLOC(p->m_pBuf, new_capacity);
        if (!pNew_buf)
            return MZ_FALSE;
        p->m_pBuf = pNew_buf;
        p->m_capacity = new_capacity;
    }
    memcpy((mz_uint8 *)p->m_pBuf + p->m_size, pBuf, len);
    p->m_size = new_size;
    return MZ_TRUE;
}